

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::base::
CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
::Grow(CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
       *this,size_t new_capacity)

{
  uint uVar1;
  code *pcVar2;
  char *pcVar3;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  type this_00;
  vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  *pvVar7;
  _Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
  local_58;
  ulong local_48;
  uint64_t i_1;
  ulong local_30;
  uint64_t i;
  size_t new_size;
  AlignedUniquePtr<std::vector<std::pair<unsigned_int,_unsigned_long>_>[]> new_vec;
  size_t new_capacity_local;
  CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
  *this_local;
  
  local_58._M_head_impl =
       (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
        *)new_capacity;
  if (new_capacity == 0) {
    local_58._M_head_impl =
         (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
          *)(this->capacity_ << 1);
  }
  new_vec._M_t.
  super___uniq_ptr_impl<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>,_true,_true>
        )(__uniq_ptr_data<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>,_true,_true>
          )local_58._M_head_impl;
  if (((ulong)local_58._M_head_impl & (long)(local_58._M_head_impl + -1) + 0x17U) != 0) {
    pcVar3 = Basename(
                     "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                     );
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    LogMessage(kLogError,pcVar3,0xc6f9,"%s (errno: %d, %s)",
               "PERFETTO_CHECK((new_capacity & (new_capacity - 1)) == 0)",(ulong)uVar1,pcVar6);
    MaybeSerializeLastLogsForCrashReporting();
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  if (local_58._M_head_impl <= this->capacity_) {
    pcVar3 = Basename(
                     "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                     );
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    LogMessage(kLogError,pcVar3,0xc6fd,"%s (errno: %d, %s)",
               "PERFETTO_CHECK(new_capacity > capacity_)",(ulong)uVar1,pcVar6);
    MaybeSerializeLastLogsForCrashReporting();
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  AlignedAllocTyped<std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>[]>
            ((base *)&new_size,(size_t)local_58._M_head_impl);
  i = 0;
  for (local_30 = this->begin_; local_30 < this->end_; local_30 = local_30 + 1) {
    this_00 = std::
              unique_ptr<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>[],_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
              ::operator[]((unique_ptr<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>[],_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
                            *)&new_size,i);
    pvVar7 = Get(this,local_30);
    std::
    vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
    ::vector(this_00,pvVar7);
    i = i + 1;
  }
  for (local_48 = this->begin_; local_48 < this->end_; local_48 = local_48 + 1) {
    pvVar7 = Get(this,local_48);
    std::
    vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
    ::~vector(pvVar7);
  }
  this->begin_ = 0;
  this->end_ = i;
  this->capacity_ =
       (size_t)new_vec._M_t.
               super___uniq_ptr_impl<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
               .
               super__Head_base<0UL,_std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_*,_false>
               ._M_head_impl;
  std::
  unique_ptr<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>[],_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
  ::operator=(&this->entries_,
              (unique_ptr<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>[],_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
               *)&new_size);
  std::
  unique_ptr<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>[],_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>[],_perfetto::base::AlignedDeleter<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>_>
                 *)&new_size);
  return;
}

Assistant:

void Grow(size_t new_capacity = 0) {
    // Capacity must be always a power of two. This allows Get() to use a simple
    // bitwise-AND for handling the wrapping instead of a full division.
    new_capacity = new_capacity ? new_capacity : capacity_ * 2;
    PERFETTO_CHECK((new_capacity & (new_capacity - 1)) == 0);  // Must be pow2.

    // On 32-bit systems this might hit the 4GB wall and overflow. We can't do
    // anything other than crash in this case.
    PERFETTO_CHECK(new_capacity > capacity_);

    AlignedUniquePtr<T[]> new_vec = AlignedAllocTyped<T[]>(new_capacity);

    // Move all elements in the expanded array.
    size_t new_size = 0;
    for (uint64_t i = begin_; i < end_; i++)
      new (&new_vec[new_size++]) T(std::move(*Get(i)));  // Placement move ctor.

    // Even if all the elements are std::move()-d and likely empty, we are still
    // required to call the dtor for them.
    for (uint64_t i = begin_; i < end_; i++)
      Get(i)->~T();

    begin_ = 0;
    end_ = new_size;
    capacity_ = new_capacity;
    entries_ = std::move(new_vec);
  }